

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsKeyChordPressed(ImGuiKeyChord key_chord,ImGuiInputFlags flags,ImGuiID owner_id)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiKey IVar3;
  uint uVar4;
  ImGuiKey IVar5;
  ImGuiKey key;
  
  pIVar1 = GImGui;
  IVar3 = FixupKeyChord(key_chord);
  IVar5 = IVar3 & ImGuiMod_Mask_;
  if ((pIVar1->IO).KeyMods != IVar5) {
    return false;
  }
  key = IVar3 & ~ImGuiMod_Mask_;
  if ((((IVar3 & ~ImGuiMod_Mask_) == ImGuiKey_KeysData_OFFSET) &&
      (key = IVar5, IVar3 - ImGuiKey_ModCtrl < 0x8000)) &&
     (uVar4 = IVar3 - ImGuiKey_ModCtrl >> 0xc, (0x8bU >> (uVar4 & 0x1f) & 1) != 0)) {
    key = *(ImGuiKey *)(&DAT_001f98e0 + (ulong)uVar4 * 4);
  }
  bVar2 = IsKeyPressed(key,flags & 0xff,owner_id);
  return bVar2;
}

Assistant:

bool ImGui::IsKeyChordPressed(ImGuiKeyChord key_chord, ImGuiInputFlags flags, ImGuiID owner_id)
{
    ImGuiContext& g = *GImGui;
    key_chord = FixupKeyChord(key_chord);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (g.IO.KeyMods != mods)
        return false;

    // Special storage location for mods
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);
    if (!IsKeyPressed(key, (flags & ImGuiInputFlags_RepeatMask_), owner_id))
        return false;
    return true;
}